

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall QPDFObjectHandle::rotatePage(QPDFObjectHandle *this,int angle,bool relative)

{
  QPDFObjectHandle *this_00;
  size_type this_01;
  bool bVar1;
  uint uVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  runtime_error *this_02;
  int iVar4;
  QPDFObjGen og;
  QPDFObjectHandle cur_obj;
  set visited;
  QPDFObjectHandle local_b8;
  undefined1 local_a8 [40];
  string local_80;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  uVar2 = angle * -0x5b05b05b + 0x2d82d82;
  if (0x2d82d82 < (uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f)) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_02,"QPDF::rotatePage called with an angle that is not a multiple of 90");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (relative) {
    local_80._M_dataplus._M_p =
         (pointer)(this->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_80._M_string_length =
         (size_type)
         (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_60._24_8_ = local_60 + 8;
    local_60._8_4_ = _S_red;
    iVar3 = 0;
    local_60._16_8_ = (_Base_ptr)0x0;
    local_38 = 0;
    this_00 = (QPDFObjectHandle *)(local_a8 + 0x10);
    local_80.field_2._M_allocated_capacity = (size_type)(element_type *)(ulong)(uint)angle;
    local_80.field_2._8_8_ = this;
    local_40 = (_Base_ptr)local_60._24_8_;
    while( true ) {
      if ((element_type *)local_80._M_dataplus._M_p == (element_type *)0x0) {
        og.obj = 0;
        og.gen = 0;
      }
      else {
        og = *(QPDFObjGen *)((long)local_80._M_dataplus._M_p + 0x50);
      }
      bVar1 = QPDFObjGen::set::add((set *)local_60,og);
      if (!bVar1) break;
      local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/Rotate","");
      getKey(this_00,&local_80);
      bVar1 = isInteger(this_00);
      if (bVar1) {
        iVar3 = getIntValueAsInt(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._24_8_);
      }
      if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_a8) {
        operator_delete(local_b8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_a8._0_8_ + 1);
      }
      if (bVar1) break;
      local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/Parent","");
      getKey(this_00,&local_80);
      bVar1 = isDictionary(this_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._24_8_);
      }
      if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_a8) {
        operator_delete(local_b8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_a8._0_8_ + 1);
      }
      if (!bVar1) break;
      local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/Parent","");
      getKey(this_00,&local_80);
      this_01 = local_80._M_string_length;
      local_80._M_string_length = local_a8._24_8_;
      local_80._M_dataplus._M_p = (pointer)local_a8._16_8_;
      local_a8._16_8_ = (element_type *)0x0;
      local_a8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._24_8_);
      }
      if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_a8) {
        operator_delete(local_b8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_a8._0_8_ + 1);
      }
    }
    uVar2 = iVar3 * -0x5b05b05b + 0x2d82d82;
    iVar4 = 0;
    if ((uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) < 0x2d82d83) {
      iVar4 = iVar3;
    }
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                 *)local_60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
    }
    angle = (int)local_80.field_2._M_allocated_capacity + iVar4;
    this = (QPDFObjectHandle *)local_80.field_2._8_8_;
  }
  local_60._0_8_ = (QPDF *)(local_60 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"/Rotate","");
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  iVar3 = (int)((ulong)((long)(angle + 0x168) * -0x49f49f49) >> 0x20) + angle + 0x168;
  (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eeae8
  ;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)(long)(angle + 0x168 + ((iVar3 >> 8) - (iVar3 >> 0x1f)) * -0x168);
  *(undefined1 *)
   &local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._vptr__Sp_counted_base = 4;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._M_use_count = 0;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._M_weak_count = 0;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[5]._M_use_count = 0;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[5]._M_weak_count = 0;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[6]._M_use_count = -1;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[6]._M_weak_count = -1;
  replaceKey(this,(string *)local_60,&local_b8);
  if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((QPDF *)local_60._0_8_ != (QPDF *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
  }
  return;
}

Assistant:

void
QPDFObjectHandle::rotatePage(int angle, bool relative)
{
    if ((angle % 90) != 0) {
        throw std::runtime_error(
            "QPDF::rotatePage called with an angle that is not a multiple of 90");
    }
    int new_angle = angle;
    if (relative) {
        int old_angle = 0;
        QPDFObjectHandle cur_obj = *this;
        QPDFObjGen::set visited;
        while (visited.add(cur_obj)) {
            // Don't get stuck in an infinite loop
            if (cur_obj.getKey("/Rotate").getValueAsInt(old_angle)) {
                break;
            } else if (cur_obj.getKey("/Parent").isDictionary()) {
                cur_obj = cur_obj.getKey("/Parent");
            } else {
                break;
            }
        }
        QTC::TC("qpdf", "QPDFObjectHandle found old angle", visited.size() > 1 ? 0 : 1);
        if ((old_angle % 90) != 0) {
            old_angle = 0;
        }
        new_angle += old_angle;
    }
    new_angle = (new_angle + 360) % 360;
    // Make this explicit even with new_angle == 0 since /Rotate can be inherited.
    replaceKey("/Rotate", QPDFObjectHandle::newInteger(new_angle));
}